

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase60::run(TestCase60 *this)

{
  bool bVar1;
  size_t sVar2;
  ArrayPtr<unsigned_char> local_150;
  ArrayPtr<const_unsigned_char> local_140;
  bool local_129;
  undefined1 auStack_128 [7];
  bool _kj_shouldLog_5;
  ArrayPtr<const_unsigned_char> local_118;
  ArrayPtr<const_unsigned_char> local_108;
  bool local_f1;
  undefined1 auStack_f0 [7];
  bool _kj_shouldLog_4;
  undefined1 local_e0 [8];
  Builder builder;
  bool local_b9;
  undefined1 auStack_b8 [7];
  bool _kj_shouldLog_3;
  undefined1 local_a8 [8];
  Reader data3;
  undefined1 auStack_90 [4];
  byte c [4];
  bool local_79;
  undefined1 auStack_78 [7];
  bool _kj_shouldLog_2;
  undefined1 local_68 [8];
  Reader data2;
  uint local_50;
  bool local_49;
  undefined1 auStack_48 [7];
  bool _kj_shouldLog_1;
  bool local_31;
  undefined1 auStack_30 [7];
  bool _kj_shouldLog;
  undefined1 local_20 [8];
  Reader data;
  TestCase60 *this_local;
  
  data.super_ArrayPtr<const_unsigned_char>.size_ = (size_t)this;
  _local_20 = (ArrayPtr<const_unsigned_char>)dataLit("foo");
  _auStack_30 = (ArrayPtr<const_unsigned_char>)dataLit("foo");
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)auStack_30,
                     (ArrayPtr<const_unsigned_char> *)local_20);
  if (!bVar1) {
    local_31 = kj::_::Debug::shouldLog(ERROR);
    while (local_31 != false) {
      _auStack_48 = (ArrayPtr<const_unsigned_char>)dataLit("foo");
      kj::_::Debug::log<char_const(&)[44],capnp::Data::Reader,capnp::Data::Reader&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x3f,ERROR,
                 "\"failed: expected \" \"(dataLit(\\\"foo\\\")) == (data)\", dataLit(\"foo\"), data"
                 ,(char (*) [44])"failed: expected (dataLit(\"foo\")) == (data)",
                 (Reader *)auStack_48,(Reader *)local_20);
      local_31 = false;
    }
  }
  sVar2 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_20);
  if (sVar2 != 3) {
    local_49 = kj::_::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      local_50 = 3;
      data2.super_ArrayPtr<const_unsigned_char>.size_ =
           kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_20);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x40,ERROR,"\"failed: expected \" \"(3u) == (data.size())\", 3u, data.size()",
                 (char (*) [39])"failed: expected (3u) == (data.size())",&local_50,
                 &data2.super_ArrayPtr<const_unsigned_char>.size_);
      local_49 = false;
    }
  }
  _local_68 = (ArrayPtr<const_unsigned_char>)dataLit("bar");
  _auStack_78 = (ArrayPtr<const_unsigned_char>)dataLit("bar");
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)auStack_78,
                     (ArrayPtr<const_unsigned_char> *)local_68);
  if (!bVar1) {
    local_79 = kj::_::Debug::shouldLog(ERROR);
    while (local_79 != false) {
      _auStack_90 = (ArrayPtr<const_unsigned_char>)dataLit("bar");
      kj::_::Debug::log<char_const(&)[45],capnp::Data::Reader,capnp::Data::Reader&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"(dataLit(\\\"bar\\\")) == (data2)\", dataLit(\"bar\"), data2"
                 ,(char (*) [45])"failed: expected (dataLit(\"bar\")) == (data2)",
                 (Reader *)auStack_90,(Reader *)local_68);
      local_79 = false;
    }
  }
  data3.super_ArrayPtr<const_unsigned_char>.size_._4_4_ = 0x7a6162;
  Data::Reader::Reader
            ((Reader *)local_a8,(byte *)((long)&data3.super_ArrayPtr<const_unsigned_char>.size_ + 4)
             ,3);
  _auStack_b8 = (ArrayPtr<const_unsigned_char>)dataLit("baz");
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)auStack_b8,
                     (ArrayPtr<const_unsigned_char> *)local_a8);
  if (!bVar1) {
    local_b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_b9 != false) {
      join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)dataLit("baz");
      kj::_::Debug::log<char_const(&)[45],capnp::Data::Reader,capnp::Data::Reader&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x47,ERROR,
                 "\"failed: expected \" \"(dataLit(\\\"baz\\\")) == (data3)\", dataLit(\"baz\"), data3"
                 ,(char (*) [45])"failed: expected (dataLit(\"baz\")) == (data3)",
                 (Reader *)&builder.super_ArrayPtr<unsigned_char>.size_,(Reader *)local_a8);
      local_b9 = false;
    }
  }
  Data::Builder::Builder
            ((Builder *)local_e0,
             (byte *)((long)&data3.super_ArrayPtr<const_unsigned_char>.size_ + 4),3);
  _auStack_f0 = (ArrayPtr<const_unsigned_char>)dataLit("baz");
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)auStack_f0,(ArrayPtr<unsigned_char> *)local_e0
                    );
  if (!bVar1) {
    local_f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_f1 != false) {
      local_108 = (ArrayPtr<const_unsigned_char>)dataLit("baz");
      kj::_::Debug::log<char_const(&)[47],capnp::Data::Reader,capnp::Data::Builder&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"(dataLit(\\\"baz\\\")) == (builder)\", dataLit(\"baz\"), builder"
                 ,(char (*) [47])"failed: expected (dataLit(\"baz\")) == (builder)",
                 (Reader *)&local_108,(Builder *)local_e0);
      local_f1 = false;
    }
  }
  local_118 = (ArrayPtr<const_unsigned_char>)dataLit("az");
  _auStack_128 = kj::ArrayPtr<unsigned_char>::slice((ArrayPtr<unsigned_char> *)local_e0,1,3);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_118,
                     (ArrayPtr<unsigned_char> *)auStack_128);
  if (!bVar1) {
    local_129 = kj::_::Debug::shouldLog(ERROR);
    while (local_129 != false) {
      local_140 = (ArrayPtr<const_unsigned_char>)dataLit("az");
      local_150 = kj::ArrayPtr<unsigned_char>::slice((ArrayPtr<unsigned_char> *)local_e0,1,3);
      kj::_::Debug::log<char_const(&)[58],capnp::Data::Reader,kj::ArrayPtr<unsigned_char>>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x4c,ERROR,
                 "\"failed: expected \" \"(dataLit(\\\"az\\\")) == (builder.slice(1, 3))\", dataLit(\"az\"), builder.slice(1, 3)"
                 ,(char (*) [58])"failed: expected (dataLit(\"az\")) == (builder.slice(1, 3))",
                 (Reader *)&local_140,&local_150);
      local_129 = false;
    }
  }
  return;
}

Assistant:

TEST(Blob, Data) {
  Data::Reader data = dataLit("foo");

  EXPECT_EQ(dataLit("foo"), data);
  EXPECT_EQ(3u, data.size());

  Data::Reader data2 = dataLit("bar");
  EXPECT_EQ(dataLit("bar"), data2);

  byte c[4] = "baz";
  Data::Reader data3(c, 3);
  EXPECT_EQ(dataLit("baz"), data3);

  Data::Builder builder(c, 3);
  EXPECT_EQ(dataLit("baz"), builder);

  EXPECT_EQ(dataLit("az"), builder.slice(1, 3));
}